

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsMeshCompare(FmsMesh lhs,FmsMesh rhs)

{
  FmsInt FVar1;
  char **ppcVar2;
  FmsDomain *ppFVar3;
  FmsInt *pFVar4;
  char **ppcVar5;
  FmsDomain *ppFVar6;
  FmsInt *pFVar7;
  FmsInt FVar8;
  FmsInt FVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  FmsInt FVar15;
  ulong uVar16;
  FmsComponent rhs_00;
  FmsTag rhs_01;
  FmsComponent lhs_00;
  FmsTag lhs_01;
  ulong uVar17;
  FmsInt j;
  FmsInt FVar18;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs != (FmsMesh)0x0) {
    if (rhs != (FmsMesh)0x0) {
      FVar1 = lhs->num_domain_names;
      iVar14 = 1;
      if (FVar1 == rhs->num_domain_names) {
        if (FVar1 == 0) {
          iVar14 = 0;
        }
        else {
          ppcVar2 = lhs->domain_names;
          ppFVar3 = lhs->domains;
          pFVar4 = lhs->domain_offsets;
          ppcVar5 = rhs->domain_names;
          ppFVar6 = rhs->domains;
          pFVar7 = rhs->domain_offsets;
          FVar15 = 0;
          iVar14 = 0;
          do {
            FVar8 = pFVar4[FVar15];
            FVar18 = pFVar4[FVar15 + 1];
            FVar9 = pFVar7[FVar15];
            iVar12 = strcmp(ppcVar2[FVar15],ppcVar5[FVar15]);
            if ((iVar12 == 0) && (FVar18 - FVar8 == pFVar7[FVar15 + 1] - FVar9)) {
              FVar18 = 0;
              do {
                iVar13 = FmsDomainCompare(ppFVar3[FVar8 + FVar18],ppFVar6[FVar9 + FVar18]);
                iVar12 = iVar14 + 100;
                if (iVar13 == 0) {
                  iVar12 = iVar14;
                }
                iVar14 = iVar12;
                FVar18 = FVar18 + 1;
              } while (FVar1 != FVar18);
            }
            else {
              iVar14 = iVar14 + 10;
            }
            FVar15 = FVar15 + 1;
          } while (FVar15 != FVar1);
        }
      }
      uVar10 = lhs->num_comps;
      if (uVar10 == rhs->num_comps) {
        if (uVar10 != 0) {
          uVar11 = lhs->num_comps;
          uVar17 = rhs->num_comps;
          uVar16 = 0;
          do {
            if (uVar16 < uVar11) {
              lhs_00 = lhs->comps[uVar16];
            }
            else {
              lhs_00 = (FmsComponent)0x0;
            }
            if (uVar16 < uVar17) {
              rhs_00 = rhs->comps[uVar16];
            }
            else {
              rhs_00 = (FmsComponent)0x0;
            }
            iVar13 = FmsComponentCompare(lhs_00,rhs_00);
            iVar12 = iVar14 + 1000;
            if (iVar13 == 0) {
              iVar12 = iVar14;
            }
            iVar14 = iVar12;
            uVar16 = uVar16 + 1;
          } while (uVar10 != uVar16);
        }
      }
      else {
        iVar14 = iVar14 + 1000;
      }
      FVar1 = lhs->num_tags;
      if (FVar1 == rhs->num_tags) {
        if (FVar1 != 0) {
          uVar10 = lhs->num_tags;
          uVar11 = rhs->num_tags;
          uVar17 = 0;
          do {
            if (uVar17 < uVar10) {
              lhs_01 = lhs->tags[uVar17];
            }
            else {
              lhs_01 = (FmsTag)0x0;
            }
            if (uVar17 < uVar11) {
              rhs_01 = rhs->tags[uVar17];
            }
            else {
              rhs_01 = (FmsTag)0x0;
            }
            iVar13 = FmsTagCompare(lhs_01,rhs_01);
            iVar12 = iVar14 + 10000;
            if (iVar13 == 0) {
              iVar12 = iVar14;
            }
            iVar14 = iVar12;
            uVar17 = uVar17 + 1;
          } while (FVar1 != uVar17);
        }
      }
      else {
        iVar14 = iVar14 + 10000;
      }
      return iVar14;
    }
    return -2;
  }
  return -1;
}

Assistant:

int FmsMeshCompare(FmsMesh lhs, FmsMesh rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;
  // Compare domain names size
  FmsInt lhs_ndnames = 0, rhs_ndnames = -1;
  FmsMeshGetNumDomainNames(lhs, &lhs_ndnames);
  FmsMeshGetNumDomainNames(rhs, &rhs_ndnames);

  // Compare domain names & domains
  if(lhs_ndnames != rhs_ndnames) {
    diff += 1;
  } else {
    for(FmsInt i = 0; i < lhs_ndnames; i++) {
      const char *lhs_dname = NULL, *rhs_dname = NULL;
      FmsInt lhs_ndomains = 0, rhs_ndomains = -1;
      FmsDomain *lhs_domains = NULL, *rhs_domains = NULL;
      FmsMeshGetDomains(lhs, i, &lhs_dname, &lhs_ndomains, &lhs_domains);
      FmsMeshGetDomains(rhs, i, &rhs_dname, &rhs_ndomains, &rhs_domains);
      if(strcmp(lhs_dname, rhs_dname)) {
        diff += 10;
        continue;
      }
      if(lhs_ndomains != rhs_ndomains) {
        diff += 10;
        continue;
      }
      for(FmsInt j = 0; j < lhs_ndnames; j++) {
        if(FmsDomainCompare(lhs_domains[j], rhs_domains[j])) {
          diff += 100;
        }
      }
    }
  }

  // Compare components
  FmsInt lhs_ncomponents = 0, rhs_ncomponents = -1;
  FmsMeshGetNumComponents(lhs, &lhs_ncomponents);
  FmsMeshGetNumComponents(rhs, &rhs_ncomponents);
  if(lhs_ncomponents != rhs_ncomponents) {
    diff += 1000;
  } else {
    for(FmsInt i = 0; i < lhs_ncomponents; i++) {
      FmsComponent lhs_component = NULL, rhs_component = NULL;
      FmsMeshGetComponent(lhs, i, &lhs_component);
      FmsMeshGetComponent(rhs, i, &rhs_component);
      if(FmsComponentCompare(lhs_component, rhs_component)) {
        diff += 1000;
      }
    }
  }

  // Compare tags
  FmsInt lhs_ntags = 0, rhs_ntags = -1;
  FmsMeshGetNumTags(lhs, &lhs_ntags);
  FmsMeshGetNumTags(rhs, &rhs_ntags);
  if(lhs_ntags != rhs_ntags) {
    diff += 10000;
  } else {
    for(FmsInt i = 0; i < lhs_ntags; i++) {
      FmsTag lhs_tag = NULL, rhs_tag = NULL;
      FmsMeshGetTag(lhs, i, &lhs_tag);
      FmsMeshGetTag(rhs, i, &rhs_tag);
      if(FmsTagCompare(lhs_tag, rhs_tag)) {
        diff += 10000;
      }
    }
  }

  // Q: Should we actually compare PartitionId?
  //  I feel like if two meshes identical meshes came from two different partitions
  //  then we should say they are equal.
  // FmsMeshGetPartitionId
  return diff;
}